

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

int al_ustr_offset(ALLEGRO_USTR *us,int index)

{
  _Bool _Var1;
  size_t sVar2;
  int in_ESI;
  ALLEGRO_USTR *in_RDI;
  int pos;
  int local_18;
  int local_14;
  
  local_18 = 0;
  local_14 = in_ESI;
  if (in_ESI < 0) {
    sVar2 = al_ustr_length(in_RDI);
    local_14 = local_14 + (int)sVar2;
  }
  do {
    if (local_14 < 1) {
      return local_18;
    }
    local_14 = local_14 + -1;
    _Var1 = al_ustr_next(in_RDI,&local_18);
  } while (_Var1);
  return local_18;
}

Assistant:

int al_ustr_offset(const ALLEGRO_USTR *us, int index)
{
   int pos = 0;

   if (index < 0)
      index += al_ustr_length(us);

   while (index-- > 0) {
      if (!al_ustr_next(us, &pos))
         return pos;
   }

   return pos;
}